

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::ZSobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,ZSobolSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  pointer pSVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  allocator_type local_29;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n != 0) {
    iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,(long)n << 5,8)
    ;
    if (0 < n) {
      pSVar2 = (__return_storage_ptr__->
               super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      uVar8 = CONCAT44(extraout_var,iVar6);
      do {
        uVar3 = *(undefined8 *)&this->seed;
        uVar4 = this->mortonIndex;
        uVar5 = *(undefined8 *)&this->dimension;
        uVar9 = uVar8 | 0x6000000000000;
        uVar8 = uVar8 + 0x20;
        puVar1 = (undefined8 *)(CONCAT44(extraout_var,iVar6) + lVar7 * 4);
        *puVar1 = *(undefined8 *)this;
        puVar1[1] = uVar3;
        puVar1[2] = uVar4;
        puVar1[3] = uVar5;
        *(ulong *)((long)&(pSVar2->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits + lVar7) = uVar9;
        lVar7 = lVar7 + 8;
      } while ((ulong)(uint)n << 3 != lVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> ZSobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    ZSobolSampler *samplerMem = (ZSobolSampler *)alloc.allocate_object<ZSobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}